

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clustergraph.cpp
# Opt level: O2

ClusterGraph * __thiscall
libDAI::ClusterGraph::VarElim
          (ClusterGraph *__return_storage_ptr__,ClusterGraph *this,
          vector<libDAI::Var,_std::allocator<libDAI::Var>_> *ElimSeq)

{
  pointer n;
  ClusterGraph Cl;
  VarSet VStack_d8;
  BipartiteGraph<libDAI::Var,_libDAI::VarSet> local_b8;
  
  BipartiteGraph<libDAI::Var,_libDAI::VarSet>::BipartiteGraph
            (&local_b8,&this->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>);
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._E12.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V1.
  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V1.
  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V1.
  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
  super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
  super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
  super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._E12.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._E12.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  eraseNonMaximal((ClusterGraph *)&local_b8);
  for (n = (ElimSeq->super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>)._M_impl.
           super__Vector_impl_data._M_start;
      n != (ElimSeq->super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>)._M_impl.
           super__Vector_impl_data._M_finish; n = n + 1) {
    Delta(&VStack_d8,(ClusterGraph *)&local_b8,n);
    insert(__return_storage_ptr__,&VStack_d8);
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&VStack_d8);
    delta(&VStack_d8,(ClusterGraph *)&local_b8,n);
    insert((ClusterGraph *)&local_b8,&VStack_d8);
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&VStack_d8);
    eraseSubsuming((ClusterGraph *)&local_b8,n);
    eraseNonMaximal((ClusterGraph *)&local_b8);
  }
  BipartiteGraph<libDAI::Var,_libDAI::VarSet>::~BipartiteGraph(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

ClusterGraph ClusterGraph::VarElim( const std::vector<Var> & ElimSeq ) const {
        // Make a copy
        ClusterGraph Cl(*this);

        ClusterGraph result;
        Cl.eraseNonMaximal();
        
        // Do variable elimination
        for( vector<Var>::const_iterator n = ElimSeq.begin(); n != ElimSeq.end(); n++ ) {
            assert( Cl.vars() && *n );

            result.insert( Cl.Delta(*n) );

            Cl.insert( Cl.delta(*n) );
            Cl.eraseSubsuming( *n );
            Cl.eraseNonMaximal();
        }

        return result;
    }